

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

string * __thiscall
pybind11::detail::replace_newlines_and_squash_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *text)

{
  detail dVar1;
  void *pvVar2;
  long lVar3;
  bool bVar4;
  detail *pdVar5;
  string result;
  allocator<char> local_51;
  _Alloc_hider local_50;
  ulong local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)this,&local_51);
  if (((local_48 < 2) || (*local_50._M_p != '\'')) || (local_50._M_p[local_48 - 1] != '\'')) {
    local_48 = 0;
    *local_50._M_p = '\0';
    dVar1 = *this;
    if (dVar1 != (detail)0x0) {
      pdVar5 = this + 1;
      bVar4 = false;
      do {
        pvVar2 = memchr(" \t\n\r\f\v",(int)(char)dVar1,7);
        if (pvVar2 == (void *)0x0) {
          std::__cxx11::string::push_back((char)&local_50);
          bVar4 = false;
        }
        else if (!bVar4) {
          bVar4 = true;
          std::__cxx11::string::push_back((char)&local_50);
        }
        dVar1 = *pdVar5;
        pdVar5 = pdVar5 + 1;
      } while (dVar1 != (detail)0x0);
    }
    lVar3 = std::__cxx11::string::find_first_not_of((char *)&local_50,0x14ad66,0);
    if (lVar3 == -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      std::__cxx11::string::find_last_not_of((char *)&local_50,0x14ad66,0xffffffffffffffff);
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_50);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_50._M_p == &local_40) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    }
    __return_storage_ptr__->_M_string_length = local_48;
    local_48 = 0;
    local_40 = '\0';
    local_50._M_p = &local_40;
  }
  if (local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string replace_newlines_and_squash(const char *text) {
    const char *whitespaces = " \t\n\r\f\v";
    std::string result(text);
    bool previous_is_whitespace = false;

    if (result.size() >= 2) {
        // Do not modify string representations
        char first_char = result[0];
        char last_char = result[result.size() - 1];
        if (first_char == last_char && first_char == '\'') {
            return result;
        }
    }
    result.clear();

    // Replace characters in whitespaces array with spaces and squash consecutive spaces
    while (*text != '\0') {
        if (std::strchr(whitespaces, *text)) {
            if (!previous_is_whitespace) {
                result += ' ';
                previous_is_whitespace = true;
            }
        } else {
            result += *text;
            previous_is_whitespace = false;
        }
        ++text;
    }

    // Strip leading and trailing whitespaces
    const size_t str_begin = result.find_first_not_of(whitespaces);
    if (str_begin == std::string::npos) {
        return "";
    }

    const size_t str_end = result.find_last_not_of(whitespaces);
    const size_t str_range = str_end - str_begin + 1;

    return result.substr(str_begin, str_range);
}